

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# straight-recognizer.cpp
# Opt level: O0

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::StraightRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,StraightRecognizer *this)

{
  initializer_list<mahjong::Pattern> __l;
  initializer_list<mahjong::Pattern> __l_00;
  const_reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  allocator<mahjong::Pattern> local_76;
  less<mahjong::Pattern> local_75;
  Pattern local_74;
  iterator local_70;
  size_type local_68;
  int local_60;
  int i;
  allocator<mahjong::Pattern> local_4e;
  less<mahjong::Pattern> local_4d;
  Pattern local_4c;
  iterator local_48;
  size_type local_40;
  array<bool,_3UL> *local_38;
  value_type *it;
  iterator __end1;
  iterator __begin1;
  NumberFlag *__range1;
  StraightRecognizer *this_local;
  
  __begin1 = (this->has_front_tile_of_sequences)._M_elems;
  __range1 = (NumberFlag *)this;
  this_local = (StraightRecognizer *)__return_storage_ptr__;
  __end1 = std::array<std::array<bool,_3UL>,_9UL>::begin
                     ((array<std::array<bool,_3UL>,_9UL> *)__begin1);
  it = std::array<std::array<bool,_3UL>,_9UL>::end((array<std::array<bool,_3UL>,_9UL> *)__begin1);
  while( true ) {
    if (__end1 == it) {
      local_60 = 0;
      do {
        if (2 < local_60) {
          memset(__return_storage_ptr__,0,0x30);
          std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::set(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        pvVar2 = std::array<std::array<bool,_3UL>,_9UL>::operator[]
                           (&this->has_front_tile_of_sequences,0);
        pvVar3 = std::array<bool,_3UL>::operator[](pvVar2,(long)local_60);
        if ((*pvVar3 & 1U) != 0) {
          pvVar2 = std::array<std::array<bool,_3UL>,_9UL>::operator[]
                             (&this->has_front_tile_of_sequences,3);
          pvVar3 = std::array<bool,_3UL>::operator[](pvVar2,(long)local_60);
          if ((*pvVar3 & 1U) != 0) {
            pvVar2 = std::array<std::array<bool,_3UL>,_9UL>::operator[]
                               (&this->has_front_tile_of_sequences,6);
            pvVar3 = std::array<bool,_3UL>::operator[](pvVar2,(long)local_60);
            if ((*pvVar3 & 1U) != 0) {
              local_74 = Straight;
              local_70 = &local_74;
              local_68 = 1;
              std::allocator<mahjong::Pattern>::allocator(&local_76);
              __l._M_len = local_68;
              __l._M_array = local_70;
              std::
              set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
              ::set(__return_storage_ptr__,__l,&local_75,&local_76);
              std::allocator<mahjong::Pattern>::~allocator(&local_76);
              return __return_storage_ptr__;
            }
          }
        }
        local_60 = local_60 + 1;
      } while( true );
    }
    local_38 = __end1;
    pvVar1 = std::array<bool,_3UL>::operator[](__end1,0);
    if ((((*pvVar1 & 1U) != 0) &&
        (pvVar1 = std::array<bool,_3UL>::operator[](local_38,1), (*pvVar1 & 1U) != 0)) &&
       (pvVar1 = std::array<bool,_3UL>::operator[](local_38,2), (*pvVar1 & 1U) != 0)) break;
    __end1 = __end1 + 1;
  }
  local_4c = ThreeColourStraights;
  local_48 = &local_4c;
  local_40 = 1;
  std::allocator<mahjong::Pattern>::allocator(&local_4e);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
            (__return_storage_ptr__,__l_00,&local_4d,&local_4e);
  std::allocator<mahjong::Pattern>::~allocator(&local_4e);
  return __return_storage_ptr__;
}

Assistant:

std::set<Pattern> StraightRecognizer::recognize()
{
	for (const auto& it : has_front_tile_of_sequences)
	{
		if (it[0] && it[1] && it[2])
		{
			return { Pattern::ThreeColourStraights };
		}
	}

	for (auto i = 0; i < 3; i++)
	{
		// check tiles 1, 4 and 7 each suit
		// 123 456 789 xxx
		if (has_front_tile_of_sequences[0][i] &&
			has_front_tile_of_sequences[3][i] &&
			has_front_tile_of_sequences[6][i])
		{
			return { Pattern::Straight };
		}
	}

	return {};
}